

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzerResults.cpp
# Opt level: O2

void __thiscall
MidiAnalyzerResults::results(MidiAnalyzerResults *this,MidiFrameType mFrameType,stash mStash1)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char number_str [128];
  char channelNum [1024];
  
  AnalyzerHelpers::GetNumberString
            (*(ulonglong *)&this->field_0x30,this->localDisplay_base,8,number_str,0x80);
  switch(mFrameType) {
  case Command:
    uVar2 = snprintf(channelNum,0x400,"Command Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"Com Ch %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    pcVar4 = "C";
    break;
  case Data:
    uVar2 = snprintf(channelNum,0x400,"Data Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"Data Ch %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    goto LAB_00105ccb;
  case NoteOff:
    uVar2 = snprintf(channelNum,0x400,"NoteOff Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"NOff Chan %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "N";
    pcVar3 = "NOff";
    break;
  case NoteOn:
    uVar2 = snprintf(channelNum,0x400,"NoteOn Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"NOn Chan %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "N";
    pcVar3 = "NOn";
    break;
  case Aftertouch:
    uVar2 = snprintf(channelNum,0x400,"Aftertouch Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"Aft Chan %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "A";
    pcVar3 = "Aft";
    break;
  case ContinuousController:
    uVar2 = snprintf(channelNum,0x400,"ContinuousController Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"ContinuControl Chan %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"ContinuControl",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "C";
    pcVar3 = "CC";
    break;
  case PatchChange:
    uVar2 = snprintf(channelNum,0x400,"PatchChange Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"P_Ch Chan %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "P";
    pcVar3 = "PCh";
    break;
  case ChannelPressure:
    uVar2 = snprintf(channelNum,0x400,"ChannelPressure Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"ChanPres Chan %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "C";
    pcVar3 = "ChanPres";
    break;
  case PitchBend:
    uVar2 = snprintf(channelNum,0x400,"PitchBend Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"PitchB Chan %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "P";
    pcVar3 = "PitchB";
    break;
  case Key:
    uVar2 = snprintf(channelNum,0x400,"Key Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "K";
    pcVar3 = "Key";
    break;
  case Velocity:
    uVar2 = snprintf(channelNum,0x400,"Velocity Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "V";
    pcVar3 = "Velocity";
    break;
  case Touch:
    uVar2 = snprintf(channelNum,0x400,"Touch Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "T";
    pcVar3 = "Touch";
    break;
  case ControllerNum:
    uVar2 = snprintf(channelNum,0x400,"ControllerNum Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "CN";
    pcVar3 = "ControllerNum";
    break;
  case ControllerValue:
    uVar2 = snprintf(channelNum,0x400,"ControllerValue Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "CV";
    pcVar3 = "ControllerValue";
    break;
  case InstrumentNum:
    uVar2 = snprintf(channelNum,0x400,"InstrumentNum Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "IN";
    pcVar3 = "InstrumentNum";
    break;
  case Pressure:
    uVar2 = snprintf(channelNum,0x400,"Pressure Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "P";
    pcVar3 = "Pressure";
    break;
  case LSB:
    uVar2 = snprintf(channelNum,0x400,"LSB Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "L";
    pcVar3 = "LSB";
    break;
  case MSB:
    uVar2 = snprintf(channelNum,0x400,"MSB Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "M";
    pcVar3 = "MSB";
    break;
  case orphanedData:
    uVar2 = snprintf(channelNum,0x400,"orphanedData Channel: %i [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "o";
    pcVar3 = "orphanedData";
    break;
  case BeginSystemExclusiveMessage:
    uVar2 = snprintf(channelNum,0x400,"BeginSystemExclusiveMessage  [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"BegSystemExclMessage  [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"BegSystemExclMessage",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SysExclMes",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "SE";
    pcVar3 = "SysEx";
    break;
  case MIDITimeCodeQuarterFrame:
    uVar2 = snprintf(channelNum,0x400,"MIDITimeCodeQuarterFrame  [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"TimeCodeQuarFr  [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"TimeCodeQuarFr",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "QF";
    pcVar3 = "QuarFr";
    break;
  case SongPositionPointer:
    uVar2 = snprintf(channelNum,0x400,"SongPositionPointer  [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"SongPosPoint  [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SongPosPoint",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SongPos",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "SP";
    pcVar3 = "SPP";
    break;
  case SongSelect:
    uVar2 = snprintf(channelNum,0x400,"SongSelect  [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar2 = snprintf(channelNum,0x400,"SongSel  [%s]");
    pcVar3 = "IE";
    if (uVar2 < 0x400) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SongSel",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "SS";
    pcVar3 = "SoSel";
    break;
  case F4:
    iVar1 = sprintf(channelNum,"F4  [%s]",number_str);
    pcVar3 = "IE";
    if (-1 < iVar1) {
      pcVar3 = channelNum;
    }
    pcVar4 = "4";
    break;
  case F5:
    iVar1 = sprintf(channelNum,"F5  [%s]",number_str);
    pcVar3 = "IE";
    if (-1 < iVar1) {
      pcVar3 = channelNum;
    }
    pcVar4 = "5";
    break;
  case TuneRequest:
    iVar1 = sprintf(channelNum,"TuneRequest  [%s]",number_str);
    pcVar3 = "IE";
    if (-1 < iVar1) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"TuneReq",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "T";
    pcVar3 = "Tune";
    break;
  case EndSystemExclusiveMessage:
    iVar1 = sprintf(channelNum,"EndSystemExclusiveMessage  [%s]",number_str);
    pcVar3 = "IE";
    if (-1 < iVar1) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"EndSystemExcMess",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"EndSysExc",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "ES";
    pcVar3 = "ESEM";
    break;
  case TimingClock:
    iVar1 = sprintf(channelNum,"TimingClock  [%s]",number_str);
    pcVar3 = "IE";
    if (-1 < iVar1) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"TimClk",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "TC";
    pcVar3 = "TiCl";
    break;
  case F9:
    iVar1 = sprintf(channelNum,"F9  [%s]",number_str);
    pcVar3 = "IE";
    if (-1 < iVar1) {
      pcVar3 = channelNum;
    }
    pcVar4 = "9";
    break;
  case Start_:
    iVar1 = sprintf(channelNum,"Start  [%s]",number_str);
    pcVar3 = "IE";
    if (-1 < iVar1) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "S";
    pcVar3 = "Sta";
    break;
  case Continue:
    iVar1 = sprintf(channelNum,"Continue  [%s]",number_str);
    pcVar3 = "IE";
    if (-1 < iVar1) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "C";
    pcVar3 = "Cont";
    break;
  case Stop_:
    iVar1 = sprintf(channelNum,"Stop  [%s]",number_str);
    pcVar3 = "IE";
    if (-1 < iVar1) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "S";
    pcVar3 = "St";
    break;
  case FD:
    iVar1 = sprintf(channelNum,"FD  [%s]",number_str);
    pcVar3 = "IE";
    if (-1 < iVar1) {
      pcVar3 = channelNum;
    }
LAB_00105ccb:
    pcVar4 = "D";
    break;
  case ActiveSensing:
    iVar1 = sprintf(channelNum,"ActiveSensing  [%s]",number_str);
    pcVar3 = "IE";
    if (-1 < iVar1) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "AS";
    pcVar3 = "ActSens";
    break;
  case SystemReset:
    iVar1 = sprintf(channelNum,"SystemReset  [%s]",number_str);
    pcVar3 = "IE";
    if (-1 < iVar1) {
      pcVar3 = channelNum;
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "SR";
    pcVar3 = "SysRes";
    break;
  case error:
    AnalyzerResults::AddResultString
              ((char *)this,"Error",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "E";
    pcVar3 = "Err";
    break;
  default:
    AnalyzerResults::AddResultString
              ((char *)this,"Internal Error, no match",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Internal Error",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar4 = "IE";
    pcVar3 = "IntErr";
  }
  AnalyzerResults::AddResultString
            ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  AnalyzerResults::AddResultString
            ((char *)this,pcVar4,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void MidiAnalyzerResults::results( enum MidiFrameType mFrameType, union stash mStash1 )
{
    char* result = NULL;
    char* frameType = NULL;
    // char * channelNum = NULL;
    char channelNum[ 1024 ];
    char buffer[ 1024 ];
    const int size = 1024;
    int charsPrinted;
    int nchars;
    S8 channel = mStash1.channel;

    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( localFrame.mData1, localDisplay_base, 8, number_str, 128 );

    // Makes a string describing the message type (data, command, what command).
    switch( mFrameType )
    {
    case Command:
        nchars = snprintf( buffer, size, "Command Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "Com Ch %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "C" );
        break;
    case Data:
        nchars = snprintf( buffer, size, "Data Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "Data Ch %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "D" );
        break;
    // End misc
    // Start data
    case Key:
        nchars = snprintf( buffer, size, "Key Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "Key" );
        AddResultString( "K" );
        break;
    case Velocity:
        nchars = snprintf( buffer, size, "Velocity Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "Velocity" );
        AddResultString( "V" );
        break;
    case Touch:
        nchars = snprintf( buffer, size, "Touch Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "Touch" );
        AddResultString( "T" );
        break;
    case ControllerNum:
        nchars = snprintf( buffer, size, "ControllerNum Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "ControllerNum" );
        AddResultString( "CN" );
        break;
    case ControllerValue:
        nchars = snprintf( buffer, size, "ControllerValue Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "ControllerValue" );
        AddResultString( "CV" );
        break;
    case InstrumentNum:
        nchars = snprintf( buffer, size, "InstrumentNum Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "InstrumentNum" );
        AddResultString( "IN" );
        break;
    case Pressure:
        nchars = snprintf( buffer, size, "Pressure Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "Pressure" );
        AddResultString( "P" );
        break;
    case LSB:
        nchars = snprintf( buffer, size, "LSB Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "LSB" );
        AddResultString( "L" );
        break;
    case MSB:
        nchars = snprintf( buffer, size, "MSB Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "MSB" );
        AddResultString( "M" );
        break;
    case orphanedData:
        nchars = snprintf( buffer, size, "orphanedData Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "orphanedData" );
        AddResultString( "o" );
        break;
    // End data
    // Start commands
    case NoteOff:
        nchars = snprintf( buffer, size, "NoteOff Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "NOff Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "NOff" );
        AddResultString( "N" );
        break;
    case NoteOn:
        nchars = snprintf( buffer, size, "NoteOn Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "NOn Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "NOn" );
        AddResultString( "N" );
        break;
    case Aftertouch:
        nchars = snprintf( buffer, size, "Aftertouch Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "Aft Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "Aft" );
        AddResultString( "A" );
        break;
    case ContinuousController:
        nchars = snprintf( buffer, size, "ContinuousController Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "ContinuControl Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "ContinuControl" );
        AddResultString( "CC" );
        AddResultString( "C" );
        break;
    case PatchChange:
        nchars = snprintf( buffer, size, "PatchChange Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "P_Ch Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "PCh" );
        AddResultString( "P" );
        break;
    case ChannelPressure:
        nchars = snprintf( buffer, size, "ChannelPressure Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "ChanPres Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "ChanPres" );
        AddResultString( "C" );
        break;
    case PitchBend:
        nchars = snprintf( buffer, size, "PitchBend Channel: %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "PitchB Chan %i [%s]", channel, number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "PitchB" );
        AddResultString( "P" );
        break;
    // End commands
    // Start non-musical commands.  They do not have channels.
    case BeginSystemExclusiveMessage:
        nchars = snprintf( buffer, size, "BeginSystemExclusiveMessage  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "BegSystemExclMessage  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "BegSystemExclMessage" );
        AddResultString( "SysExclMes" );
        AddResultString( "SysEx" );
        AddResultString( "SE" );
        break;
    case MIDITimeCodeQuarterFrame:
        nchars = snprintf( buffer, size, "MIDITimeCodeQuarterFrame  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "TimeCodeQuarFr  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "TimeCodeQuarFr" );
        AddResultString( "QuarFr" );
        AddResultString( "QF" );
        break;
    case SongPositionPointer:
        nchars = snprintf( buffer, size, "SongPositionPointer  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "SongPosPoint  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "SongPosPoint" );
        AddResultString( "SongPos" );
        AddResultString( "SPP" );
        AddResultString( "SP" );
        break;
    case SongSelect:
        nchars = snprintf( buffer, size, "SongSelect  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        nchars = snprintf( buffer, size, "SongSel  [%s]", number_str );
        if( nchars >= 0 && nchars < size )
        {
            AddResultString( buffer );
        }
        else
            AddResultString( "IE" );

        AddResultString( "SongSel" );
        AddResultString( "SoSel" );
        AddResultString( "SS" );
        break;
    case F4:
        nchars = sprintf( channelNum, "F4  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "4" );
        break;
    case F5:
        nchars = sprintf( channelNum, "F5  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "5" );
        break;
    case TuneRequest:
        nchars = sprintf( channelNum, "TuneRequest  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "TuneReq" );
        AddResultString( "Tune" );
        AddResultString( "T" );
        break;
    case EndSystemExclusiveMessage:
        nchars = sprintf( channelNum, "EndSystemExclusiveMessage  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "EndSystemExcMess" );
        AddResultString( "EndSysExc" );
        AddResultString( "ESEM" );
        AddResultString( "ES" );
        break;
    case TimingClock:
        nchars = sprintf( channelNum, "TimingClock  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "TimClk" );
        AddResultString( "TiCl" );
        AddResultString( "TC" );
        break;
    case F9:
        nchars = sprintf( channelNum, "F9  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "9" );
        break;
    case Start_:
        nchars = sprintf( channelNum, "Start  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "Sta" );
        AddResultString( "S" );
        break;
    case Continue:
        nchars = sprintf( channelNum, "Continue  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "Cont" );
        AddResultString( "C" );
        break;
    case Stop_:
        nchars = sprintf( channelNum, "Stop  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "St" );
        AddResultString( "S" );
        break;
    case FD:
        nchars = sprintf( channelNum, "FD  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "D" );
        break;
    case ActiveSensing:
        nchars = sprintf( channelNum, "ActiveSensing  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "ActSens" );
        AddResultString( "AS" );
        break;
    case SystemReset:
        nchars = sprintf( channelNum, "SystemReset  [%s]", number_str );
        if( nchars >= 0 )
        {
            AddResultString( channelNum );
        }
        else
            AddResultString( "IE" );
        AddResultString( "SysRes" );
        AddResultString( "SR" );
        break;
    // non-musical commands
    // Start errors
    case error:
        AddResultString( "Error" );
        AddResultString( "Err" );
        AddResultString( "E" );
        break;
    default:
        AddResultString( "Internal Error, no match" );
        AddResultString( "Internal Error" );
        AddResultString( "IntErr" );
        AddResultString( "IE" );
        break;
    }
    //	Command, Data,
    //	NoteOff, NoteOn, Aftertouch, ContinuousController, PatchChange, ChannelPressure, PitchBend,
    //	BeginSystemExclusiveMessage, MIDITimeCodeQuarterFrame, SongPositionPointer, SongSelect, F4, F5, TuneRequest,
    // EndSystemExclusiveMessage, 	TimingClock, Start, Continue, Stop, FD, ActiveSensing, SystemReset
}